

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindAllExtensionNumbers
          (MergedDescriptorDatabase *this,string *extendee_type,
          vector<int,_std::allocator<int>_> *output)

{
  pointer *ppiVar1;
  bool bVar2;
  uint uVar3;
  reference ppDVar4;
  iterator __i;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> iVar5;
  insert_iterator<std::vector<int,_std::allocator<int>_>_> local_f8;
  _Rb_tree_const_iterator<int> local_e8;
  _Rb_tree_const_iterator<int> local_e0;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> local_d8;
  _Base_ptr local_c8;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> local_c0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  DescriptorDatabase *local_90;
  DescriptorDatabase *source;
  iterator __end2;
  iterator __begin2;
  vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
  *__range2;
  undefined1 local_68 [7];
  bool success;
  vector<int,_std::allocator<int>_> results;
  set<int,_std::less<int>,_std::allocator<int>_> merged_results;
  vector<int,_std::allocator<int>_> *output_local;
  string *extendee_type_local;
  MergedDescriptorDatabase *this_local;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_68);
  __range2._7_1_ = false;
  __end2 = std::
           vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
           ::begin(&this->sources_);
  source = (DescriptorDatabase *)
           std::
           vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
           ::end(&this->sources_);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<google::protobuf::DescriptorDatabase_**,_std::vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>_>
                                *)&source);
    if (!bVar2) break;
    ppDVar4 = __gnu_cxx::
              __normal_iterator<google::protobuf::DescriptorDatabase_**,_std::vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>_>
              ::operator*(&__end2);
    local_90 = *ppDVar4;
    uVar3 = (*local_90->_vptr_DescriptorDatabase[5])(local_90,extendee_type,local_68);
    if ((uVar3 & 1) != 0) {
      local_a8._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)local_68);
      local_b0._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_68);
      ppiVar1 = &results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_c8 = (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)ppiVar1);
      std::insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::insert_iterator
                (&local_c0,(set<int,_std::less<int>,_std::allocator<int>_> *)ppiVar1,(_Iter)local_c8
                );
      iVar5 = std::
              copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>>
                        (local_a8,local_b0,local_c0);
      __range2._7_1_ = true;
      local_d8 = iVar5;
    }
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)local_68);
    __gnu_cxx::
    __normal_iterator<google::protobuf::DescriptorDatabase_**,_std::vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>_>
    ::operator++(&__end2);
  }
  ppiVar1 = &results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  local_e0._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)ppiVar1);
  local_e8._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)ppiVar1);
  __i = std::vector<int,_std::allocator<int>_>::end(output);
  std::insert_iterator<std::vector<int,_std::allocator<int>_>_>::insert_iterator
            (&local_f8,output,(_Iter)__i._M_current);
  std::
  copy<std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::vector<int,std::allocator<int>>>>
            (local_e0,local_e8,local_f8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return __range2._7_1_;
}

Assistant:

bool MergedDescriptorDatabase::FindAllExtensionNumbers(
    const std::string& extendee_type, std::vector<int>* output) {
  std::set<int> merged_results;
  std::vector<int> results;
  bool success = false;

  for (DescriptorDatabase* source : sources_) {
    if (source->FindAllExtensionNumbers(extendee_type, &results)) {
      std::copy(results.begin(), results.end(),
                std::insert_iterator<std::set<int> >(merged_results,
                                                     merged_results.begin()));
      success = true;
    }
    results.clear();
  }

  std::copy(merged_results.begin(), merged_results.end(),
            std::insert_iterator<std::vector<int> >(*output, output->end()));

  return success;
}